

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::dwarf::ReadRangeList
               (CU *cu,uint64_t low_pc,string_view name,RangeSink *sink,string_view *data)

{
  CompilationUnitSizes *pCVar1;
  RangeSink *pRVar2;
  RangeSink *pRVar3;
  CompilationUnitSizes *analyzer;
  CompilationUnitSizes *in_RSI;
  CU *in_RDI;
  uint64_t size;
  uint64_t end;
  uint64_t start;
  uint64_t max_address;
  string name_str;
  string_view *in_stack_ffffffffffffff38;
  CompilationUnitSizes *in_stack_ffffffffffffff40;
  RangeSink *this;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [48];
  CompilationUnitSizes *local_20;
  CU *local_18;
  
  __a = &local_51;
  local_20 = in_RSI;
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,__a);
  std::allocator<char>::~allocator(&local_51);
  pCVar1 = CU::unit_sizes(local_18);
  pRVar2 = (RangeSink *)CompilationUnitSizes::MaxAddress(pCVar1);
  pCVar1 = local_20;
  while( true ) {
    local_20 = pCVar1;
    CU::unit_sizes(local_18);
    pRVar3 = (RangeSink *)
             CompilationUnitSizes::ReadAddress(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    this = pRVar3;
    analyzer = CU::unit_sizes(local_18);
    in_stack_ffffffffffffff40 =
         (CompilationUnitSizes *)
         CompilationUnitSizes::ReadAddress(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((pRVar3 == (RangeSink *)0x0) && (in_stack_ffffffffffffff40 == (CompilationUnitSizes *)0x0))
    break;
    pCVar1 = in_stack_ffffffffffffff40;
    if (pRVar3 != pRVar2) {
      RangeSink::AddVMRangeIgnoreDuplicate
                (this,(char *)analyzer,(uint64_t)in_stack_ffffffffffffff40,
                 (uint64_t)in_stack_ffffffffffffff38,(string *)0x20b57c);
      pCVar1 = local_20;
    }
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void ReadRangeList(const CU& cu, uint64_t low_pc, string_view name,
                   RangeSink* sink, string_view* data) {
  std::string name_str(name);
  uint64_t max_address = cu.unit_sizes().MaxAddress();
  while (true) {
    uint64_t start, end;
    start = cu.unit_sizes().ReadAddress(data);
    end = cu.unit_sizes().ReadAddress(data);
    if (start == 0 && end == 0) {
      return;
    } else if (start == max_address) {
      low_pc = end;
    } else {
      uint64_t size = end - start;
      sink->AddVMRangeIgnoreDuplicate("dwarf_rangelist", low_pc + start, size,
                                      name_str);
    }
  }
}